

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryMultipleStreamsMultipleBufferPerStream::iterate
          (TransformFeedbackOverflowQueryMultipleStreamsMultipleBufferPerStream *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *pNVar4;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  TransformFeedbackOverflowQueryMultipleStreamsMultipleBufferPerStream *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryMultipleStreamsBase).
                      super_TransformFeedbackOverflowQueryFunctionalBase.
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (!bVar1) {
    local_4d = 1;
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Required transform_feedback3 extension is not supported",
               &local_39);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_38);
    local_4d = 0;
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsGpuShader5
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (!bVar1) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Required gpu_shader5 extension is not supported",&local_71);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_70);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  (**(code **)(local_18 + 0x30))(0);
  TransformFeedbackOverflowQueryMultipleStreamsBase::drawStreams
            (&this->super_TransformFeedbackOverflowQueryMultipleStreamsBase,8,8,0,0);
  (**(code **)(local_18 + 0xfe0))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0','\0','\0','\0','\0');
  TransformFeedbackOverflowQueryMultipleStreamsBase::drawStreams
            (&this->super_TransformFeedbackOverflowQueryMultipleStreamsBase,0xb,0xb,0,0);
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0','\0','\0','\0','\0');
  (**(code **)(local_18 + 0x1248))();
  TransformFeedbackOverflowQueryMultipleStreamsBase::drawStreams
            (&this->super_TransformFeedbackOverflowQueryMultipleStreamsBase,1,3,0,0);
  (**(code **)(local_18 + 0xfe0))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\x01','\0','\x01','\0','\0');
  (**(code **)(local_18 + 0x1248))();
  TransformFeedbackOverflowQueryMultipleStreamsBase::drawStreams
            (&this->super_TransformFeedbackOverflowQueryMultipleStreamsBase,1,0,0,0);
  (**(code **)(local_18 + 0xfe0))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0','\0','\0','\0','\0');
  (**(code **)(local_18 + 0x1248))();
  TransformFeedbackOverflowQueryMultipleStreamsBase::drawStreams
            (&this->super_TransformFeedbackOverflowQueryMultipleStreamsBase,1,1,0,0);
  (**(code **)(local_18 + 0x638))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\x01','\x01','\x01','\0','\0');
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQueryMultipleStreamsBase).
             super_TransformFeedbackOverflowQueryFunctionalBase.
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// If GL 4.0 and ARB_transform_feedback3 are not supported then skip this
		// test case.
		if (!supportsTransformFeedback3())
		{
			throw tcu::NotSupportedError("Required transform_feedback3 extension is not supported");
		}

		// If GL 4.0 and ARB_gpu_shader5 are not supported then skip this
		// test case.
		if (!supportsGpuShader5())
		{
			throw tcu::NotSupportedError("Required gpu_shader5 extension is not supported");
		}

		// Call BeginTransformFeedback with mode POINTS.
		gl.beginTransformFeedback(GL_POINTS);

		// Start all queries, submit draw that results in feeding back exactly 8
		// points to both vertex streams, then stop the queries.
		drawStreams(8, 8);

		// Call PauseTransformFeedback.
		gl.pauseTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// queries are all FALSE.
		verifyQueryResults(GL_FALSE, GL_FALSE, GL_FALSE);

		// Start the queries, submit draw that would result in feeding back more
		// than 10 points for both vertex streams if transform feedback wasn't
		// paused, then stop the queries.
		drawStreams(11, 11);

		// Use the basic checking mechanism to validate that the result of the
		// queries are all FALSE.
		verifyQueryResults(GL_FALSE, GL_FALSE, GL_FALSE);

		// Call ResumeTransformFeedback.
		gl.resumeTransformFeedback();

		// Start the queries, submit draw that results in feeding back exactly 1
		// point for vertex stream #0 and exactly 3 points for vertex stream #1,
		// then stop the queries.
		drawStreams(1, 3);

		// Call PauseTransformFeedback.
		gl.pauseTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// queries are all FALSE, except for the TRANSFORM_FEEDBACK_OVERFLOW_ARB
		// query, and the TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB query for vertex
		// stream #1, which should have a TRUE result.
		verifyQueryResults(GL_TRUE, GL_FALSE, GL_TRUE);

		// Call ResumeTransformFeedback.
		gl.resumeTransformFeedback();

		// Start the queries, submit draw that results in feeding back exactly 1
		// point only for vertex stream #0, then stop the queries.
		drawStreams(1, 0);

		// Call PauseTransformFeedback.
		gl.pauseTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// queries are all FALSE.
		verifyQueryResults(GL_FALSE, GL_FALSE, GL_FALSE);

		// Call ResumeTransformFeedback.
		gl.resumeTransformFeedback();

		// Start the queries, submit draw that results in feeding back exactly 1
		// point for vertex streams #0 and #1, then stop the queries.
		drawStreams(1, 1);

		// Call EndTransformFeedback.
		gl.endTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// queries are all FALSE, except for the TRANSFORM_FEEDBACK_OVERFLOW_ARB
		// query, and the TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB queries for
		// vertex streams #0 and #1, which should have a TRUE result.
		verifyQueryResults(GL_TRUE, GL_TRUE, GL_TRUE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}